

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree.c
# Opt level: O3

void test_read_format_mtree_nochange(void)

{
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  archive *paVar4;
  char *pcVar5;
  time_t tVar6;
  la_int64_t lVar7;
  archive_entry *ae;
  archive_entry *local_38;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ƹ',"a",L'Ơ',L'\xffffffff',"12345");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ƹ',"b",L'ƴ',L'\xffffffff',"123456");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ƺ',"c",L'ǭ',L'\xffffffff',"1234567");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'ƿ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǁ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǃ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_set_options(paVar4,"mtree:checkfs");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǅ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_options(a, \"mtree:checkfs\")",paVar4);
  iVar1 = archive_read_open_memory(paVar4,test_read_format_mtree_nochange::archive,0x6b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǉ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open_memory(a, archive, sizeof(archive))",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǈ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ǉ',pcVar5,"archive_entry_pathname(ae)","./a","\"./a\"",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǌ',(ulong)mVar2,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  tVar6 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǋ',tVar6,"archive_entry_mtime(ae)",0x7b,"123",(void *)0x0);
  lVar7 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǌ',lVar7,"archive_entry_size(ae)",5,"5",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǎ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǎ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǐ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ǐ',pcVar5,"archive_entry_pathname(ae)","./b","\"./b\"",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǒ',(ulong)mVar2,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  tVar6 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǒ',tVar6,"archive_entry_mtime(ae)",0xea,"234",(void *)0x0);
  lVar7 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǔ',lVar7,"archive_entry_size(ae)",6,"6",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǔ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǖ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǖ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'Ǘ',pcVar5,"archive_entry_pathname(ae)","./c","\"./c\"",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǘ',(ulong)mVar2,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  tVar6 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǚ',tVar6,"archive_entry_mtime(ae)",0x159,"345",(void *)0x0);
  lVar7 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǚ',lVar7,"archive_entry_size(ae)",7,"7",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǜ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǜ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǟ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  iVar1 = archive_file_count(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǟ',3,"3",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǡ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǡ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'Ǧ',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǫ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4)
  ;
  iVar1 = archive_read_set_options(paVar4,"mtree:checkfs");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǭ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_options(a, \"mtree:checkfs\")",paVar4);
  iVar1 = archive_read_open_memory(paVar4,test_read_format_mtree_nochange::archive2,0x7d);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǯ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open_memory(a, archive2, sizeof(archive2))",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǯ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ǰ',pcVar5,"archive_entry_pathname(ae)","./a","\"./a\"",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǲ',(ulong)mVar2,"archive_entry_mode(ae)",0x81a0,"AE_IFREG | 0640",
                      (void *)0x0);
  tVar6 = archive_entry_mtime(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'Ǵ',(uint)(tVar6 != 0x7b),"archive_entry_mtime(ae) != 123",(void *)0x0);
  lVar7 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǵ',lVar7,"archive_entry_size(ae)",5,"5",(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ƕ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'Ƿ',pcVar5,"archive_entry_pathname(ae)","./b","\"./b\"",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǹ',(ulong)mVar2,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  tVar6 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǹ',tVar6,"archive_entry_mtime(ae)",0xea,"234",(void *)0x0);
  lVar7 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǻ',lVar7,"archive_entry_size(ae)",6,"6",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǻ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ǽ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ǽ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pcVar5 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'Ǿ',pcVar5,"archive_entry_pathname(ae)","./c","\"./c\"",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȁ',(ulong)mVar2,"archive_entry_mode(ae)",0x81ed,"AE_IFREG | 0755",
                      (void *)0x0);
  tVar6 = archive_entry_mtime(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'Ȃ',(uint)(tVar6 != 0x159),"archive_entry_mtime(ae) != 345",(void *)0x0);
  lVar7 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȃ',lVar7,"archive_entry_size(ae)",7,"7",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȅ',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȅ',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȇ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  iVar1 = archive_file_count(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȉ',3,"3",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ȉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'Ȋ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_nochange)
{
	static char archive[] =
	    "#mtree\n"
	    "./a type=file mode=0644 time=123\n"
	    "./b type=file mode=0644 time=234\n"
	    "./c type=file mode=0644 time=345\n";
	static char archive2[] =
	    "#mtree\n"
	    "./a type=file mode=0644 time=123 nochange\n"
	    "./b type=file mode=0644 time=234\n"
	    "./c type=file mode=0644 time=345 nochange\n";
	struct archive_entry *ae;
	struct archive *a;

	assertMakeFile("a", 0640, "12345");
	assertMakeFile("b", 0664, "123456");
	assertMakeFile("c", 0755, "1234567");

	/*
	 * Test 1. Read a mtree archive without `nochange' keyword.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./a");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_mtime(ae), 123);
	assertEqualInt(archive_entry_size(ae), 5);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./b");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_mtime(ae), 234);
	assertEqualInt(archive_entry_size(ae), 6);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./c");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_mtime(ae), 345);
	assertEqualInt(archive_entry_size(ae), 7);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(3, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test 2. Read a mtree archive with `nochange' keyword.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive2, sizeof(archive2)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./a");
#if !defined(_WIN32) || defined(__CYGWIN__)
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0640);
#endif
	assert(archive_entry_mtime(ae) != 123);
	assertEqualInt(archive_entry_size(ae), 5);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./b");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_mtime(ae), 234);
	assertEqualInt(archive_entry_size(ae), 6);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./c");
#if !defined(_WIN32) || defined(__CYGWIN__)
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0755);
#endif
	assert(archive_entry_mtime(ae) != 345);
	assertEqualInt(archive_entry_size(ae), 7);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(3, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}